

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O2

void classdef_free(classdef_t *classdef)

{
  int32 i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 < classdef->n_words; lVar1 = lVar1 + 1) {
    ckd_free(classdef->words[lVar1]);
  }
  ckd_free(classdef->words);
  ckd_free(classdef->weights);
  ckd_free(classdef);
  return;
}

Assistant:

void
classdef_free(classdef_t * classdef)
{
    int32 i;
    for (i = 0; i < classdef->n_words; ++i)
        ckd_free(classdef->words[i]);
    ckd_free(classdef->words);
    ckd_free(classdef->weights);
    ckd_free(classdef);
}